

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkset_tpl.h
# Opt level: O3

uint8_t * CHUNKCOPY_SAFE(uint8_t *out,uint8_t *from,uint64_t len,uint8_t *safe)

{
  uint8_t *puVar1;
  undefined8 uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint8_t *cur_chunk;
  undefined4 *__dest;
  uint uVar8;
  uint64_t bytes_remaining;
  undefined1 auVar9 [16];
  chunk_t_conflict chunk_load;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  uint8_t *local_38;
  
  __dest = &local_48;
  uVar4 = (long)out - (long)from;
  if (uVar4 == 0) goto LAB_00112a5d;
  uVar7 = (long)safe - (long)out;
  if (uVar7 < len) {
    len = uVar7;
  }
  uVar5 = (long)safe - (long)from;
  uVar6 = -uVar5;
  if (0 < (long)uVar5) {
    uVar6 = uVar5;
  }
  if ((uVar7 < 0x10) || (uVar6 < 0x10)) {
    if (len == 0) {
      return out;
    }
    uVar4 = 0;
    do {
      out[uVar4] = from[uVar4];
      uVar4 = uVar4 + 1;
    } while (len != uVar4);
LAB_00112975:
    return out + uVar4;
  }
  uVar7 = -uVar4;
  if (0 < (long)uVar4) {
    uVar7 = uVar4;
  }
  uVar8 = (uint)len;
  if (((long)uVar4 < 0) && (uVar4 = len & 0xffffffff, uVar7 < uVar4)) {
    memmove(out,from,uVar4);
    return out + uVar4;
  }
  if (uVar7 == 1) {
    len = len & 0xffffffff;
    memset(out,(uint)*from,len);
    goto LAB_00112a5d;
  }
  if (0xf < uVar7) {
    uVar3 = uVar8 - 1 & 0xf;
    uVar2 = *(undefined8 *)(from + 8);
    *(undefined8 *)out = *(undefined8 *)from;
    *(undefined8 *)(out + 8) = uVar2;
    if (~uVar3 + uVar8 == 0) {
      return out + (ulong)uVar3 + 1;
    }
    uVar4 = (ulong)uVar3 + 1;
    do {
      uVar2 = *(undefined8 *)(from + uVar4 + 8);
      *(undefined8 *)(out + uVar4) = *(undefined8 *)(from + uVar4);
      *(undefined8 *)(out + uVar4 + 8) = uVar2;
      uVar4 = uVar4 + 0x10;
    } while (uVar8 != (uint)uVar4);
    goto LAB_00112975;
  }
  if (uVar7 == 8) {
    local_48 = *(undefined4 *)from;
    uStack_44 = *(undefined4 *)(from + 4);
LAB_001129bc:
    uVar3 = 0x10;
    uStack_40 = local_48;
    uStack_3c = uStack_44;
  }
  else {
    if (uVar7 == 4) {
      local_48 = *(undefined4 *)from;
      uStack_44 = local_48;
      goto LAB_001129bc;
    }
    if (uVar7 == 2) {
      auVar9 = pshuflw(ZEXT216(*(ushort *)from),ZEXT216(*(ushort *)from),0);
      local_48 = auVar9._0_4_;
      uStack_44 = local_48;
      goto LAB_001129bc;
    }
    uVar4 = 0x10;
    local_38 = from;
    do {
      uVar6 = uVar7;
      if (uVar4 < uVar7) {
        uVar6 = uVar4;
      }
      memcpy(__dest,local_38,uVar6);
      __dest = (undefined4 *)((long)__dest + uVar6);
      uVar4 = uVar4 - uVar6;
    } while (uVar4 != 0);
    uVar3 = 0x10 - (int)uVar6;
  }
  if (0x1f < uVar8) {
    do {
      *(undefined4 *)out = local_48;
      *(undefined4 *)(out + 4) = uStack_44;
      *(undefined4 *)(out + 8) = uStack_40;
      *(undefined4 *)(out + 0xc) = uStack_3c;
      puVar1 = out + uVar3;
      *(undefined4 *)puVar1 = local_48;
      *(undefined4 *)(puVar1 + 4) = uStack_44;
      *(undefined4 *)(puVar1 + 8) = uStack_40;
      *(undefined4 *)(puVar1 + 0xc) = uStack_3c;
      out = out + uVar3 * 2;
      uVar8 = (int)len + uVar3 * -2;
      len = (uint64_t)uVar8;
    } while (0x1f < uVar8);
  }
  uVar8 = (uint)len;
  if (0xf < uVar8) {
    do {
      *(ulong *)out = CONCAT44(uStack_44,local_48);
      *(ulong *)(out + 8) = CONCAT44(uStack_3c,uStack_40);
      uVar8 = (int)len - uVar3;
      len = (uint64_t)uVar8;
      out = out + uVar3;
    } while (0xf < uVar8);
  }
  if (uVar8 == 0) {
    return out;
  }
  len = (uint64_t)uVar8;
  memcpy(out,&local_48,len);
LAB_00112a5d:
  return out + len;
}

Assistant:

static inline uint8_t *CHUNKCOPY_SAFE(uint8_t *out, uint8_t *from, uint64_t len, uint8_t *safe)
{
    if (out == from)
        return out + len;

    uint64_t safelen = (safe - out);
    len = MIN(len, safelen);

#ifndef HAVE_MASKED_READWRITE
    uint64_t from_dist = (uint64_t)llabs(safe - from);
    if (UNLIKELY(from_dist < sizeof(chunk_t) || safelen < sizeof(chunk_t))) {
        while (len--) {
            *out++ = *from++;
        }

        return out;
    }
#endif

    return CHUNKMEMSET(out, from, (unsigned)len);
}